

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolutionNeighbourhood.cpp
# Opt level: O0

Solution * __thiscall SolutionNeighbourhood::getNext(SolutionNeighbourhood *this)

{
  Turn *pTVar1;
  Solution *pSVar2;
  value_type pTVar3;
  NurseSolution *pNVar4;
  NurseSolution *ns2;
  bool bVar5;
  int iVar6;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar7;
  const_reference pvVar8;
  const_reference ppTVar9;
  vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> *this_00;
  size_type sVar10;
  Scenario *this_01;
  WeekData *this_02;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>_>
  *this_03;
  string *psVar11;
  mapped_type *this_04;
  ShiftType *pSVar12;
  mapped_type *this_05;
  const_reference ppDVar13;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar14;
  pointer ppVar15;
  reference ppNVar16;
  Move *pMVar17;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar18;
  Position local_148;
  Position local_118;
  int local_e8;
  undefined1 local_e1;
  Position local_e0;
  allocator local_a9;
  string local_a8;
  Position local_88;
  _Self local_58 [3];
  _Self local_40;
  const_iterator it;
  vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> tempVector;
  Turn *currentTurn;
  SolutionNeighbourhood *this_local;
  
  undoLastMove(this);
  if (this->phase == 0) {
    do {
      do {
        pvVar7 = Solution::getTurns(this->solution);
        pvVar8 = std::
                 vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                 ::operator[](pvVar7,(long)this->iterator1);
        ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                            (pvVar8,(long)this->iterator2);
        pTVar1 = *ppTVar9;
        this_00 = Turn::getNurses(pTVar1);
        sVar10 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::size(this_00);
        this_01 = Scenario::getInstance();
        this_02 = Scenario::getWeekData(this_01);
        this_03 = WeekData::getRequirements_abi_cxx11_(this_02);
        psVar11 = Turn::getSkill_abi_cxx11_(pTVar1);
        this_04 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>_>
                  ::at(this_03,psVar11);
        pSVar12 = Turn::getShiftType(pTVar1);
        psVar11 = ShiftType::getId_abi_cxx11_(pSVar12);
        this_05 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
                  ::at(this_04,psVar11);
        iVar6 = Turn::getDay(pTVar1);
        ppDVar13 = std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>::at
                             (this_05,(long)iVar6);
        iVar6 = DayRequirement::getOptimalCoverage(*ppDVar13);
        if (sVar10 < (ulong)(long)iVar6) {
          std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::vector
                    ((vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> *)&it);
          pmVar14 = Solution::getNurses_abi_cxx11_(this->solution);
          local_40._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
               ::begin(pmVar14);
          while( true ) {
            pmVar14 = Solution::getNurses_abi_cxx11_(this->solution);
            local_58[0]._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
                 ::end(pmVar14);
            bVar5 = std::operator!=(&local_40,local_58);
            if (!bVar5) break;
            ppVar15 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
                      ::operator->(&local_40);
            std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::push_back
                      ((vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> *)&it,
                       &ppVar15->second);
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
            ::operator++(&local_40);
          }
          while (iVar6 = this->iteratorTurn1,
                sVar10 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::size
                                   ((vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> *)&it
                                   ), (ulong)(long)iVar6 < sVar10) {
            pSVar2 = this->solution;
            ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::operator[]
                                 ((vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> *)&it,
                                  (long)this->iteratorTurn1);
            bVar5 = Solution::assignNurseToTurn(pSVar2,*ppNVar16,pTVar1);
            if (bVar5) {
              pMVar17 = (Move *)operator_new(0x70);
              local_e1 = 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_a8,"",&local_a9);
              Position::Position(&local_88,-1,(ShiftType *)0x0,&local_a8);
              iVar6 = Turn::getDay(pTVar1);
              pSVar12 = Turn::getShiftType(pTVar1);
              psVar11 = Turn::getSkill_abi_cxx11_(pTVar1);
              Position::Position(&local_e0,iVar6,pSVar12,psVar11);
              ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::operator[]
                                   ((vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> *)&it
                                    ,(long)this->iteratorTurn1);
              Move::Move(pMVar17,&local_88,&local_e0,*ppNVar16);
              local_e1 = 0;
              this->lastMove = pMVar17;
              Position::~Position(&local_e0);
              Position::~Position(&local_88);
              std::__cxx11::string::~string((string *)&local_a8);
              std::allocator<char>::~allocator((allocator<char> *)&local_a9);
              this->iteratorTurn1 = this->iteratorTurn1 + 1;
              this_local = (SolutionNeighbourhood *)this->solution;
              local_e8 = 1;
              goto LAB_001356e1;
            }
            this->iteratorTurn1 = this->iteratorTurn1 + 1;
          }
          local_e8 = 0;
LAB_001356e1:
          std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::~vector
                    ((vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> *)&it);
          if (local_e8 != 0) {
            return (Solution *)this_local;
          }
        }
        this->iteratorTurn1 = 0;
        this->iterator2 = this->iterator2 + 1;
        iVar6 = this->iterator2;
        pvVar7 = Solution::getTurns(this->solution);
        pvVar8 = std::
                 vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                 ::operator[](pvVar7,(long)this->iterator1);
        sVar10 = std::vector<Turn_*,_std::allocator<Turn_*>_>::size(pvVar8);
      } while ((long)iVar6 != sVar10);
      this->iterator2 = 0;
      this->iterator1 = this->iterator1 + 1;
      iVar6 = this->iterator1;
      pvVar7 = Solution::getTurns(this->solution);
      sVar10 = std::
               vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
               ::size(pvVar7);
    } while ((long)iVar6 != sVar10);
    this->phase = this->phase + 1;
    this->iterator1 = 0;
    this->iterator2 = 0;
    this_local = (SolutionNeighbourhood *)getNext(this);
  }
  else {
    if (this->phase == 1) {
      while (iVar6 = this->iterator1,
            sVar10 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::size
                               (&this->nurseVector), (ulong)(long)iVar6 < sVar10) {
        while (iVar6 = this->iterator2,
              sVar10 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::size
                                 (&this->nurseVector), (ulong)(long)iVar6 < sVar10) {
          if (this->iterator1 != this->iterator2) {
            while( true ) {
              iVar6 = this->iteratorTurn1;
              ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::operator[]
                                   (&this->nurseVector,(long)this->iterator1);
              pvVar18 = NurseSolution::getTurns(*ppNVar16);
              sVar10 = std::vector<Turn_*,_std::allocator<Turn_*>_>::size(pvVar18);
              if (sVar10 <= (ulong)(long)iVar6) break;
              while( true ) {
                iVar6 = this->iteratorTurn2;
                ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                           operator[](&this->nurseVector,(long)this->iterator2);
                pvVar18 = NurseSolution::getTurns(*ppNVar16);
                sVar10 = std::vector<Turn_*,_std::allocator<Turn_*>_>::size(pvVar18);
                if (sVar10 <= (ulong)(long)iVar6) break;
                ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                           operator[](&this->nurseVector,(long)this->iterator1);
                pvVar18 = NurseSolution::getTurns(*ppNVar16);
                ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                                    (pvVar18,(long)this->iteratorTurn1);
                pTVar3 = *ppTVar9;
                ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                           operator[](&this->nurseVector,(long)this->iterator2);
                pvVar18 = NurseSolution::getTurns(*ppNVar16);
                ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                                    (pvVar18,(long)this->iteratorTurn2);
                if (pTVar3 == *ppTVar9) {
LAB_00135ed2:
                  this->iteratorTurn2 = this->iteratorTurn2 + 1;
                }
                else {
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator1);
                  pNVar4 = *ppNVar16;
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator2);
                  pvVar18 = NurseSolution::getTurns(*ppNVar16);
                  ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                                      (pvVar18,(long)this->iteratorTurn2);
                  bVar5 = NurseSolution::hasTurn(pNVar4,*ppTVar9);
                  if (bVar5) goto LAB_00135ed2;
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator2);
                  pNVar4 = *ppNVar16;
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator1);
                  pvVar18 = NurseSolution::getTurns(*ppNVar16);
                  ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                                      (pvVar18,(long)this->iteratorTurn1);
                  bVar5 = NurseSolution::hasTurn(pNVar4,*ppTVar9);
                  if (bVar5) goto LAB_00135ed2;
                  pMVar17 = (Move *)operator_new(0x70);
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator1);
                  pvVar18 = NurseSolution::getTurns(*ppNVar16);
                  ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                                      (pvVar18,(long)this->iteratorTurn1);
                  iVar6 = Turn::getDay(*ppTVar9);
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator1);
                  pvVar18 = NurseSolution::getTurns(*ppNVar16);
                  ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                                      (pvVar18,(long)this->iteratorTurn1);
                  pSVar12 = Turn::getShiftType(*ppTVar9);
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator1);
                  pvVar18 = NurseSolution::getTurns(*ppNVar16);
                  ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                                      (pvVar18,(long)this->iteratorTurn1);
                  psVar11 = Turn::getSkill_abi_cxx11_(*ppTVar9);
                  Position::Position(&local_118,iVar6,pSVar12,psVar11);
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator2);
                  pvVar18 = NurseSolution::getTurns(*ppNVar16);
                  ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                                      (pvVar18,(long)this->iteratorTurn2);
                  iVar6 = Turn::getDay(*ppTVar9);
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator2);
                  pvVar18 = NurseSolution::getTurns(*ppNVar16);
                  ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                                      (pvVar18,(long)this->iteratorTurn2);
                  pSVar12 = Turn::getShiftType(*ppTVar9);
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator2);
                  pvVar18 = NurseSolution::getTurns(*ppNVar16);
                  ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                                      (pvVar18,(long)this->iteratorTurn2);
                  psVar11 = Turn::getSkill_abi_cxx11_(*ppTVar9);
                  Position::Position(&local_148,iVar6,pSVar12,psVar11);
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator1);
                  pNVar4 = *ppNVar16;
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator2);
                  Move::Move(pMVar17,&local_118,&local_148,pNVar4,*ppNVar16);
                  this->lastMove = pMVar17;
                  Position::~Position(&local_148);
                  Position::~Position(&local_118);
                  pSVar2 = this->solution;
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator1);
                  pNVar4 = *ppNVar16;
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator1);
                  pvVar18 = NurseSolution::getTurns(*ppNVar16);
                  ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                                      (pvVar18,(long)this->iteratorTurn1);
                  pTVar1 = *ppTVar9;
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator2);
                  ns2 = *ppNVar16;
                  ppNVar16 = std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::
                             operator[](&this->nurseVector,(long)this->iterator2);
                  pvVar18 = NurseSolution::getTurns(*ppNVar16);
                  ppTVar9 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                                      (pvVar18,(long)this->iteratorTurn2);
                  bVar5 = Solution::atomicSwitchNurseTurns(pSVar2,pNVar4,pTVar1,ns2,*ppTVar9);
                  if (bVar5) {
                    this->iteratorTurn2 = this->iteratorTurn2 + 1;
                    return this->solution;
                  }
                  pMVar17 = this->lastMove;
                  if (pMVar17 != (Move *)0x0) {
                    Move::~Move(pMVar17);
                    operator_delete(pMVar17,0x70);
                  }
                  this->lastMove = (Move *)0x0;
                  this->iteratorTurn2 = this->iteratorTurn2 + 1;
                }
              }
              this->iteratorTurn1 = this->iteratorTurn1 + 1;
              this->iteratorTurn2 = 0;
            }
          }
          this->iterator2 = this->iterator2 + 1;
          this->iteratorTurn1 = 0;
        }
        this->iterator2 = 0;
        this->iterator1 = this->iterator1 + 1;
      }
    }
    this->ended = true;
    this_local = (SolutionNeighbourhood *)this->solution;
  }
  return (Solution *)this_local;
}

Assistant:

Solution *SolutionNeighbourhood::getNext(){
    undoLastMove();
    if(phase == 0) {
        while (1) {
            Turn *currentTurn = solution->getTurns()[iterator1][iterator2];

            if (currentTurn->getNurses().size() <
                Scenario::getInstance()->getWeekData().getRequirements().at(currentTurn->getSkill()).at(
                        currentTurn->getShiftType()->getId()).at(currentTurn->getDay())->getOptimalCoverage()) {
                vector<NurseSolution *> tempVector;
                for (auto it = solution->getNurses().begin(); it != solution->getNurses().end(); ++it) {
                    tempVector.push_back(it->second);
                }
                for (; iteratorTurn1 < tempVector.size();) {
                    if (solution->assignNurseToTurn(tempVector[iteratorTurn1], currentTurn)) {
                        lastMove = new Move(Position(-1, nullptr, ""),
                                            Position(currentTurn->getDay(), currentTurn->getShiftType(),
                                                     currentTurn->getSkill()), tempVector[iteratorTurn1]);
                        iteratorTurn1++;
                        return solution;
                    }
                    else iteratorTurn1++;
                }
            }
            iteratorTurn1 = 0;
            iterator2++;
            if (iterator2 == solution->getTurns()[iterator1].size()) {
                iterator2 = 0;
                iterator1++;
                if (iterator1 == solution->getTurns().size()) {
                    phase++;
                    iterator1 = 0;
                    iterator2 = 0;
                    return this->getNext();
                }
            }

        }
    }
    //iterate each nurse then iterate the otherNurses and check if they can trade Turns
    else if(phase == 1){
        for(;iterator1 < this->nurseVector.size();){
            for(;iterator2 < this->nurseVector.size();)
            {
                if(iterator1 != iterator2)
                    for(;iteratorTurn1 < nurseVector[iterator1]->getTurns().size();)
                    {
                        for(;iteratorTurn2 < nurseVector[iterator2]->getTurns().size();){
                            if(nurseVector[iterator1]->getTurns()[iteratorTurn1] != nurseVector[iterator2]->getTurns()[iteratorTurn2]
                                    && !nurseVector[iterator1]->hasTurn(nurseVector[iterator2]->getTurns()[iteratorTurn2]) && !nurseVector[iterator2]->hasTurn(nurseVector[iterator1]->getTurns()[iteratorTurn1])) {
                                lastMove = new Move(
                                        //initial Position
                                        Position(nurseVector[iterator1]->getTurns()[iteratorTurn1]->getDay(),
                                                 nurseVector[iterator1]->getTurns()[iteratorTurn1]->getShiftType(),
                                                 nurseVector[iterator1]->getTurns()[iteratorTurn1]->getSkill()),
                                        //lastPosition Position
                                        Position(nurseVector[iterator2]->getTurns()[iteratorTurn2]->getDay(),
                                                 nurseVector[iterator2]->getTurns()[iteratorTurn2]->getShiftType(),
                                                 nurseVector[iterator2]->getTurns()[iteratorTurn2]->getSkill()),
                                        //Ns1 / Ns2
                                        nurseVector[iterator1], nurseVector[iterator2]);

                                if(solution->atomicSwitchNurseTurns(nurseVector[iterator1],nurseVector[iterator1]->getTurns()[iteratorTurn1],nurseVector[iterator2],nurseVector[iterator2]->getTurns()[iteratorTurn2]))
                                {
                                    iteratorTurn2++;
                                    return solution;
                                    }
                                else {
                                    delete lastMove;
                                    lastMove = nullptr;
                                    iteratorTurn2++;
                                }
                            }
                            else iteratorTurn2++;
                        }
                        iteratorTurn1++;
                        iteratorTurn2 = 0;
                    }
                iterator2++;
                iteratorTurn1 = 0;
            }
            iterator2 = 0;
            iterator1++;
        }
    }
    this->ended = true;
    return solution;
}